

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regex.cpp
# Opt level: O3

int re_match(re_pattern_buffer *__buffer,char *__string,int __length,int __start,
            re_registers *__regs)

{
  char *pcVar1;
  size_type sVar2;
  char cVar3;
  string_type *other;
  char cVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int extraout_EAX;
  size_t sVar8;
  ostream *poVar9;
  runtime_error *prVar10;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  string *s;
  ulong uVar11;
  smatch sm;
  ostringstream oss;
  smatch local_208;
  string *local_1e0;
  string local_1d8 [32];
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8 [16];
  string_type *local_38;
  
  s = (string *)CONCAT44(in_register_00000014,__length);
  uVar11 = (ulong)__regs & 0xffffffff;
  cVar3 = (char)__buffer;
  local_1e0 = (string *)__string;
  booster::regex::regex((regex *)local_1b8,(string *)__string,0);
  pcVar1 = (s->_M_dataplus)._M_p;
  cVar4 = booster::regex::match((char *)local_1b8,pcVar1,(int)s->_M_string_length + (int)pcVar1);
  local_38 = (string_type *)CONCAT44(in_register_0000000c,__start);
  booster::regex::~regex((regex *)local_1b8);
  if (cVar4 != cVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x69);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9," booster::regex_match(pat,booster::regex(re))==result",0x35);
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar10,(string *)&local_208);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar1 = (s->_M_dataplus)._M_p;
  sVar2 = s->_M_string_length;
  booster::regex::regex((regex *)local_1b8,local_1e0,0);
  cVar4 = booster::regex::match((char *)local_1b8,pcVar1,(int)sVar2 + (int)pcVar1);
  booster::regex::~regex((regex *)local_1b8);
  if (cVar4 != cVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,
               " booster::regex_match(pat.c_str(),pat.c_str()+pat.size(),booster::regex(re))==result"
               ,0x54);
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar10,(string *)&local_208);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar1 = (s->_M_dataplus)._M_p;
  booster::regex::regex((regex *)local_1b8,local_1e0,0);
  sVar8 = strlen(pcVar1);
  cVar4 = booster::regex::match((char *)local_1b8,pcVar1,(int)sVar8 + (int)pcVar1);
  iVar6 = booster::regex::~regex((regex *)local_1b8);
  other = local_38;
  if (cVar4 != cVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x6b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9," booster::regex_match(pat.c_str(),booster::regex(re))==result",0x3d);
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar10,(string *)&local_208);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (cVar3 != '\0') {
    local_208.offsets_.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.offsets_.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_208.begin_._M_current = (char *)0x0;
    local_208.end_._M_current = (char *)0x0;
    local_208.offsets_.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    booster::regex::regex((regex *)local_1b8,local_1e0,0);
    bVar5 = booster::regex_match<booster::regex>(s,&local_208,(regex *)local_1b8,0);
    booster::regex::~regex((regex *)local_1b8);
    if (!bVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x70);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9," booster::regex_match(pat,sm,booster::regex(re))",0x30);
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar10,local_1d8);
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1b8[0].
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .first._M_current = (char *)0x0;
    local_1b8[0].
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .second._M_current = (char *)0x0;
    local_1b8[0].matched = false;
    iVar6 = (int)__regs;
    if (((-1 < iVar6) &&
        (iVar6 < (int)((ulong)((long)local_208.offsets_.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_208.offsets_.
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3))) &&
       ((long)local_208.offsets_.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start[uVar11].first != -1)) {
      local_1b8[0].matched = true;
      local_1b8[0].
      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .first._M_current =
           local_208.begin_._M_current +
           local_208.offsets_.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start[uVar11].first;
      local_1b8[0].
      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .second._M_current =
           local_208.begin_._M_current +
           local_208.offsets_.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start[uVar11].second;
    }
    iVar7 = booster::
            sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::compare(local_1b8,other);
    if (iVar7 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x71);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," sm[pos]==key",0xd);
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar10,local_1d8);
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_208.offsets_.
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_208.offsets_.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    local_208.offsets_.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.offsets_.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_208.begin_._M_current = (char *)0x0;
    local_208.end_._M_current = (char *)0x0;
    local_208.offsets_.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar1 = (s->_M_dataplus)._M_p;
    sVar2 = s->_M_string_length;
    booster::regex::regex((regex *)local_1b8,local_1e0,0);
    bVar5 = booster::regex_match<booster::regex>
                      (pcVar1,pcVar1 + sVar2,(cmatch *)&local_208,(regex *)local_1b8,0);
    booster::regex::~regex((regex *)local_1b8);
    if (!bVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x75);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,
                 " booster::regex_match(pat.c_str(),pat.c_str()+pat.size(),cm,booster::regex(re))",
                 0x4f);
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar10,local_1d8);
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1b8[0].
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .first._M_current = (char *)0x0;
    local_1b8[0].
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .second._M_current = (char *)0x0;
    local_1b8[0].matched = false;
    if (((-1 < iVar6) &&
        (iVar6 < (int)((ulong)((long)local_208.offsets_.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_208.offsets_.
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3))) &&
       ((long)local_208.offsets_.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start[uVar11].first != -1)) {
      local_1b8[0].matched = true;
      local_1b8[0].
      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .first._M_current =
           local_208.begin_._M_current +
           local_208.offsets_.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start[uVar11].first;
      local_1b8[0].
      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .second._M_current =
           local_208.begin_._M_current +
           local_208.offsets_.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start[uVar11].second;
    }
    iVar7 = booster::sub_match<const_char_*>::compare((sub_match<const_char_*> *)local_1b8,other);
    if (iVar7 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x76);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," cm[pos]==key",0xd);
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar10,local_1d8);
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_208.offsets_.
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_208.offsets_.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    local_208.offsets_.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.offsets_.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_208.begin_._M_current = (char *)0x0;
    local_208.end_._M_current = (char *)0x0;
    local_208.offsets_.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar1 = (s->_M_dataplus)._M_p;
    booster::regex::regex((regex *)local_1b8,local_1e0,0);
    bVar5 = booster::regex_match<booster::regex>(pcVar1,(cmatch *)&local_208,(regex *)local_1b8,0);
    booster::regex::~regex((regex *)local_1b8);
    if (!bVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x7a);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9," booster::regex_match(pat.c_str(),cm,booster::regex(re))",0x38);
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar10,local_1d8);
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1b8[0].
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .first._M_current = (char *)0x0;
    local_1b8[0].
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .second._M_current = (char *)0x0;
    local_1b8[0].matched = false;
    if (((-1 < iVar6) &&
        (iVar6 < (int)((ulong)((long)local_208.offsets_.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_208.offsets_.
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3))) &&
       ((long)local_208.offsets_.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start[uVar11].first != -1)) {
      local_1b8[0].matched = true;
      local_1b8[0].
      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .first._M_current =
           local_208.begin_._M_current +
           local_208.offsets_.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start[uVar11].first;
      local_1b8[0].
      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .second._M_current =
           local_208.begin_._M_current +
           local_208.offsets_.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start[uVar11].second;
    }
    iVar6 = booster::sub_match<const_char_*>::compare((sub_match<const_char_*> *)local_1b8,other);
    if (iVar6 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x7b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," cm[pos]==key",0xd);
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar10,local_1d8);
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar6 = 0;
    if (local_208.offsets_.
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_208.offsets_.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      iVar6 = extraout_EAX;
    }
  }
  return iVar6;
}

Assistant:

void re_match(bool result,std::string re,std::string pat,std::string key="",int pos=0)
{
	TEST(booster::regex_match(pat,booster::regex(re))==result);
	TEST(booster::regex_match(pat.c_str(),pat.c_str()+pat.size(),booster::regex(re))==result);
	TEST(booster::regex_match(pat.c_str(),booster::regex(re))==result);

	if(result) {
		{
			booster::smatch sm;
			TEST(booster::regex_match(pat,sm,booster::regex(re)));
			TEST(sm[pos]==key);
		}
		{
			booster::cmatch cm;
			TEST(booster::regex_match(pat.c_str(),pat.c_str()+pat.size(),cm,booster::regex(re)));
			TEST(cm[pos]==key);
		}
		{
			booster::cmatch cm;
			TEST(booster::regex_match(pat.c_str(),cm,booster::regex(re)));
			TEST(cm[pos]==key);
		}
	}
}